

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr res)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  uint uVar4;
  bool bVar5;
  
  if (res == (xmlXPathObjectPtr)0x0 || ctxt == (xmlXPathParserContextPtr)0x0) {
    return 0;
  }
  switch(res->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    if (res->nodesetval == (xmlNodeSetPtr)0x0) {
      return 0;
    }
    bVar5 = res->nodesetval->nodeNr == 0;
    goto LAB_001e0642;
  case XPATH_BOOLEAN:
    uVar4 = res->boolval;
    break;
  case XPATH_NUMBER:
    uVar4 = -(uint)((double)ctxt->context->proximityPosition == res->floatval) & 1;
    break;
  case XPATH_STRING:
    if (res->stringval == (xmlChar *)0x0) {
      return 0;
    }
    bVar5 = *res->stringval == '\0';
LAB_001e0642:
    uVar4 = (uint)!bVar5;
    break;
  default:
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    uVar4 = 0;
    (*p_Var1)(*ppvVar3,"Internal error at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/frida[P]libxml2/xpath.c",
              0x36d3);
  }
  return uVar4;
}

Assistant:

int
xmlXPathEvaluatePredicateResult(xmlXPathParserContextPtr ctxt,
                                xmlXPathObjectPtr res) {
    if ((ctxt == NULL) || (res == NULL)) return(0);
    switch (res->type) {
        case XPATH_BOOLEAN:
	    return(res->boolval);
        case XPATH_NUMBER:
#if defined(__BORLANDC__) || (defined(_MSC_VER) && (_MSC_VER == 1200))
	    return((res->floatval == ctxt->context->proximityPosition) &&
	           (!xmlXPathIsNaN(res->floatval))); /* MSC pbm Mark Vakoc !*/
#else
	    return(res->floatval == ctxt->context->proximityPosition);
#endif
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    if (res->nodesetval == NULL)
		return(0);
	    return(res->nodesetval->nodeNr != 0);
        case XPATH_STRING:
	    return((res->stringval != NULL) && (res->stringval[0] != 0));
#ifdef LIBXML_XPTR_LOCS_ENABLED
	case XPATH_LOCATIONSET:{
	    xmlLocationSetPtr ptr = res->user;
	    if (ptr == NULL)
	        return(0);
	    return (ptr->locNr != 0);
	    }
#endif
        default:
	    STRANGE
    }
    return(0);
}